

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

void __thiscall kj::InsertionOrderIndex::eraseImpl(InsertionOrderIndex *this,size_t pos)

{
  uint uVar1;
  Link *pLVar2;
  
  pLVar2 = this->links;
  uVar1 = pLVar2[pos + 1].next;
  pLVar2[uVar1].prev = pLVar2[pos + 1].prev;
  pLVar2[pLVar2[pos + 1].prev].next = uVar1;
  return;
}

Assistant:

void InsertionOrderIndex::eraseImpl(size_t pos) {
  Link& link = links[pos + 1];
  links[link.next].prev = link.prev;
  links[link.prev].next = link.next;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}